

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kLiveConstraints.c
# Opt level: O1

Aig_Man_t * generateWorkingAig(Aig_Man_t *pAig,Abc_Ntk_t *pNtk,int *pIndex0Live)

{
  Vec_Ptr_t *signalList;
  Aig_Man_t *pAVar1;
  
  signalList = collectCSSignals(pNtk,pAig);
  if (signalList != (Vec_Ptr_t *)0x0) {
    pAVar1 = createNewAigWith0LivePo(pAig,signalList,pIndex0Live);
    if (signalList->pArray != (void **)0x0) {
      free(signalList->pArray);
      signalList->pArray = (void **)0x0;
    }
    free(signalList);
    return pAVar1;
  }
  __assert_fail("vSignalVector",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/kLiveConstraints.c"
                ,0xa9,"Aig_Man_t *generateWorkingAig(Aig_Man_t *, Abc_Ntk_t *, int *)");
}

Assistant:

Aig_Man_t *generateWorkingAig( Aig_Man_t *pAig, Abc_Ntk_t *pNtk, int *pIndex0Live )
{
    Vec_Ptr_t *vSignalVector;
    Aig_Man_t *pAigNew;

    vSignalVector = collectCSSignals( pNtk, pAig );    
    assert(vSignalVector);
    pAigNew = createNewAigWith0LivePo( pAig, vSignalVector, pIndex0Live );
    Vec_PtrFree(vSignalVector);

    return pAigNew;
}